

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrStartSenseDataProviderCompleteBD
                   (XrSession session,XrFutureEXT future,XrFutureCompletionEXT *completion)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_310;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSession_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrFutureCompletionEXT *completion_local;
  XrFutureEXT future_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  future_local = (XrFutureEXT)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSession_T **)&future_local,&local_4c);
  VVar1 = VerifyXrSessionHandle((XrSession *)&future_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)future_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a8 = pGVar2;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (completion == (XrFutureCompletionEXT *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c8,"VUID-xrStartSenseDataProviderCompleteBD-completion-parameter",&local_2c9
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"xrStartSenseDataProviderCompleteBD",&local_2f1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_310,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_330,
                 "Invalid NULL for XrFutureCompletionEXT \"completion\" which is not optional and must be non-NULL"
                 ,&local_331);
      CoreValidLogMessage(pGVar2,(string *)local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f0,&local_310,(string *)local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_310);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"xrStartSenseDataProviderCompleteBD",&local_359);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_358,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,false,true,completion);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      pGVar2 = local_2a8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_380,"VUID-xrStartSenseDataProviderCompleteBD-completion-parameter",
                   &local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a8,"xrStartSenseDataProviderCompleteBD",&local_3a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e8,
                   "Command xrStartSenseDataProviderCompleteBD param completion is invalid",
                   &local_3e9);
        CoreValidLogMessage(pGVar2,(string *)local_380,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a8,&local_3c8,(string *)local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c8);
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_218,"VUID-xrStartSenseDataProviderCompleteBD-session-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrStartSenseDataProviderCompleteBD",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrStartSenseDataProviderCompleteBD(
XrSession session,
XrFutureEXT future,
XrFutureCompletionEXT* completion) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrStartSenseDataProviderCompleteBD-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStartSenseDataProviderCompleteBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == completion) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrStartSenseDataProviderCompleteBD-completion-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStartSenseDataProviderCompleteBD", objects_info,
                                "Invalid NULL for XrFutureCompletionEXT \"completion\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrFutureCompletionEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrStartSenseDataProviderCompleteBD", objects_info,
                                                        false, true, completion);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrStartSenseDataProviderCompleteBD-completion-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrStartSenseDataProviderCompleteBD",
                                objects_info,
                                "Command xrStartSenseDataProviderCompleteBD param completion is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}